

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  Mat *pMVar2;
  undefined4 uVar3;
  void *pvVar4;
  Allocator *pAVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int *piVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar19;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar24 [16];
  Option opt_q;
  Mat local_1a8;
  int local_154;
  Mat *local_150;
  Mat local_148;
  Mat local_100;
  Mat local_b8;
  Option local_70;
  
  if (this->dynamic_weight != 0) {
    return 0;
  }
  (*mb->_vptr_ModelBin[2])(&local_1a8,mb,(ulong)(uint)this->weight_data_size,0);
  local_150 = &this->weight_data;
  piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (local_150 != &local_1a8) {
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + 1;
      UNLOCK();
    }
    piVar11 = (this->weight_data).refcount;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        pvVar4 = (this->weight_data).data;
        pAVar5 = (this->weight_data).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data).data = local_1a8.data;
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    (this->weight_data).refcount = piVar11;
    (this->weight_data).elemsize = local_1a8.elemsize;
    (this->weight_data).elempack = local_1a8.elempack;
    (this->weight_data).allocator = local_1a8.allocator;
    (this->weight_data).dims = local_1a8.dims;
    (this->weight_data).w = local_1a8.w;
    (this->weight_data).h = local_1a8.h;
    (this->weight_data).d = local_1a8.d;
    (this->weight_data).c = local_1a8.c;
    (this->weight_data).cstep = local_1a8.cstep;
  }
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_150->data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (*mb->_vptr_ModelBin[2])(&local_1a8,mb,(ulong)(uint)this->num_output);
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (&this->bias_data != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->bias_data).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->bias_data).data;
          pAVar5 = (this->bias_data).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->bias_data).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->bias_data).refcount = piVar11;
      (this->bias_data).elemsize = local_1a8.elemsize;
      (this->bias_data).elempack = local_1a8.elempack;
      (this->bias_data).allocator = local_1a8.allocator;
      (this->bias_data).dims = local_1a8.dims;
      (this->bias_data).w = local_1a8.w;
      (this->bias_data).h = local_1a8.h;
      (this->bias_data).d = local_1a8.d;
      (this->bias_data).c = local_1a8.c;
      (this->bias_data).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  iVar19 = this->int8_scale_term;
  if (iVar19 < 0x65) {
    if (iVar19 != 1) {
      if (iVar19 != 2) goto LAB_003d58fc;
      goto LAB_003d4e17;
    }
LAB_003d4daf:
    (*mb->_vptr_ModelBin[2])(&local_1a8,mb,(ulong)(uint)this->group,1);
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (&this->weight_data_int8_scales != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->weight_data_int8_scales).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->weight_data_int8_scales).data;
          pAVar5 = (this->weight_data_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_int8_scales).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->weight_data_int8_scales).refcount = piVar11;
      (this->weight_data_int8_scales).elemsize = local_1a8.elemsize;
      (this->weight_data_int8_scales).elempack = local_1a8.elempack;
      (this->weight_data_int8_scales).allocator = local_1a8.allocator;
      (this->weight_data_int8_scales).dims = local_1a8.dims;
      (this->weight_data_int8_scales).w = local_1a8.w;
      (this->weight_data_int8_scales).h = local_1a8.h;
      (this->weight_data_int8_scales).d = local_1a8.d;
      (this->weight_data_int8_scales).c = local_1a8.c;
      (this->weight_data_int8_scales).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*mb->_vptr_ModelBin[2])(&local_1a8,mb,1);
    pMVar1 = &this->bottom_blob_int8_scales;
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (pMVar1 != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->bottom_blob_int8_scales).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->bottom_blob_int8_scales).data;
          pAVar5 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar11;
      (this->bottom_blob_int8_scales).elemsize = local_1a8.elemsize;
      (this->bottom_blob_int8_scales).elempack = local_1a8.elempack;
      (this->bottom_blob_int8_scales).allocator = local_1a8.allocator;
      (this->bottom_blob_int8_scales).dims = local_1a8.dims;
      (this->bottom_blob_int8_scales).w = local_1a8.w;
      (this->bottom_blob_int8_scales).h = local_1a8.h;
      (this->bottom_blob_int8_scales).d = local_1a8.d;
      (this->bottom_blob_int8_scales).c = local_1a8.c;
      (this->bottom_blob_int8_scales).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar3 = *(this->bottom_blob_int8_scales).data;
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    Mat::create(&local_1a8,this->group,4,(Allocator *)0x0);
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (pMVar1 != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->bottom_blob_int8_scales).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->bottom_blob_int8_scales).data;
          pAVar5 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar11;
      (this->bottom_blob_int8_scales).elemsize = local_1a8.elemsize;
      (this->bottom_blob_int8_scales).elempack = local_1a8.elempack;
      (this->bottom_blob_int8_scales).allocator = local_1a8.allocator;
      (this->bottom_blob_int8_scales).dims = local_1a8.dims;
      (this->bottom_blob_int8_scales).w = local_1a8.w;
      (this->bottom_blob_int8_scales).h = local_1a8.h;
      (this->bottom_blob_int8_scales).d = local_1a8.d;
      (this->bottom_blob_int8_scales).c = local_1a8.c;
      (this->bottom_blob_int8_scales).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    auVar9 = _DAT_005a3350;
    auVar8 = _DAT_005a3340;
    auVar7 = _DAT_005a3240;
    uVar10 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
    if (0 < (int)uVar10) {
      pvVar4 = pMVar1->data;
      lVar13 = (ulong)uVar10 - 1;
      auVar24._8_4_ = (int)lVar13;
      auVar24._0_8_ = lVar13;
      auVar24._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar14 = 0;
      auVar24 = auVar24 ^ _DAT_005a3240;
      do {
        auVar20._8_4_ = (int)uVar14;
        auVar20._0_8_ = uVar14;
        auVar20._12_4_ = (int)(uVar14 >> 0x20);
        auVar16 = (auVar20 | auVar9) ^ auVar7;
        iVar19 = auVar24._4_4_;
        if ((bool)(~(auVar16._4_4_ == iVar19 && auVar24._0_4_ < auVar16._0_4_ ||
                    iVar19 < auVar16._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4) = uVar3;
        }
        if ((auVar16._12_4_ != auVar24._12_4_ || auVar16._8_4_ <= auVar24._8_4_) &&
            auVar16._12_4_ <= auVar24._12_4_) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 4) = uVar3;
        }
        auVar20 = (auVar20 | auVar8) ^ auVar7;
        iVar25 = auVar20._4_4_;
        if (iVar25 <= iVar19 && (iVar25 != iVar19 || auVar20._0_4_ <= auVar24._0_4_)) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 8) = uVar3;
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 0xc) = uVar3;
        }
        uVar14 = uVar14 + 4;
      } while ((uVar10 + 3 & 0xfffffffc) != uVar14);
    }
  }
  else {
    if (iVar19 != 0x66) {
      if (iVar19 != 0x65) goto LAB_003d58fc;
      goto LAB_003d4daf;
    }
LAB_003d4e17:
    (*mb->_vptr_ModelBin[2])(&local_1a8,mb,1,1);
    pMVar1 = &this->weight_data_int8_scales;
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (pMVar1 != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->weight_data_int8_scales).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->weight_data_int8_scales).data;
          pAVar5 = (this->weight_data_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_int8_scales).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->weight_data_int8_scales).refcount = piVar11;
      (this->weight_data_int8_scales).elemsize = local_1a8.elemsize;
      (this->weight_data_int8_scales).elempack = local_1a8.elempack;
      (this->weight_data_int8_scales).allocator = local_1a8.allocator;
      (this->weight_data_int8_scales).dims = local_1a8.dims;
      (this->weight_data_int8_scales).w = local_1a8.w;
      (this->weight_data_int8_scales).h = local_1a8.h;
      (this->weight_data_int8_scales).d = local_1a8.d;
      (this->weight_data_int8_scales).c = local_1a8.c;
      (this->weight_data_int8_scales).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*mb->_vptr_ModelBin[2])(&local_1a8,mb,1);
    pMVar2 = &this->bottom_blob_int8_scales;
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (pMVar2 != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->bottom_blob_int8_scales).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->bottom_blob_int8_scales).data;
          pAVar5 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar11;
      (this->bottom_blob_int8_scales).elemsize = local_1a8.elemsize;
      (this->bottom_blob_int8_scales).elempack = local_1a8.elempack;
      (this->bottom_blob_int8_scales).allocator = local_1a8.allocator;
      (this->bottom_blob_int8_scales).dims = local_1a8.dims;
      (this->bottom_blob_int8_scales).w = local_1a8.w;
      (this->bottom_blob_int8_scales).h = local_1a8.h;
      (this->bottom_blob_int8_scales).d = local_1a8.d;
      (this->bottom_blob_int8_scales).c = local_1a8.c;
      (this->bottom_blob_int8_scales).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar3 = *(this->weight_data_int8_scales).data;
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    Mat::create(&local_1a8,this->group,4,(Allocator *)0x0);
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (pMVar1 != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->weight_data_int8_scales).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->weight_data_int8_scales).data;
          pAVar5 = (this->weight_data_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_int8_scales).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->weight_data_int8_scales).refcount = piVar11;
      (this->weight_data_int8_scales).elemsize = local_1a8.elemsize;
      (this->weight_data_int8_scales).elempack = local_1a8.elempack;
      (this->weight_data_int8_scales).allocator = local_1a8.allocator;
      (this->weight_data_int8_scales).dims = local_1a8.dims;
      (this->weight_data_int8_scales).w = local_1a8.w;
      (this->weight_data_int8_scales).h = local_1a8.h;
      (this->weight_data_int8_scales).d = local_1a8.d;
      (this->weight_data_int8_scales).c = local_1a8.c;
      (this->weight_data_int8_scales).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    auVar9 = _DAT_005a3350;
    auVar8 = _DAT_005a3340;
    auVar7 = _DAT_005a3240;
    uVar10 = (this->weight_data_int8_scales).c * (int)(this->weight_data_int8_scales).cstep;
    if (0 < (int)uVar10) {
      pvVar4 = pMVar1->data;
      lVar13 = (ulong)uVar10 - 1;
      auVar16._8_4_ = (int)lVar13;
      auVar16._0_8_ = lVar13;
      auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar14 = 0;
      auVar16 = auVar16 ^ _DAT_005a3240;
      do {
        auVar21._8_4_ = (int)uVar14;
        auVar21._0_8_ = uVar14;
        auVar21._12_4_ = (int)(uVar14 >> 0x20);
        auVar24 = (auVar21 | auVar9) ^ auVar7;
        iVar19 = auVar16._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar19 && auVar16._0_4_ < auVar24._0_4_ ||
                    iVar19 < auVar24._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4) = uVar3;
        }
        if ((auVar24._12_4_ != auVar16._12_4_ || auVar24._8_4_ <= auVar16._8_4_) &&
            auVar24._12_4_ <= auVar16._12_4_) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 4) = uVar3;
        }
        auVar24 = (auVar21 | auVar8) ^ auVar7;
        iVar25 = auVar24._4_4_;
        if (iVar25 <= iVar19 && (iVar25 != iVar19 || auVar24._0_4_ <= auVar16._0_4_)) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 8) = uVar3;
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 0xc) = uVar3;
        }
        uVar14 = uVar14 + 4;
      } while ((uVar10 + 3 & 0xfffffffc) != uVar14);
    }
    uVar3 = *(this->bottom_blob_int8_scales).data;
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    Mat::create(&local_1a8,this->group,4,(Allocator *)0x0);
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (pMVar2 != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->bottom_blob_int8_scales).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->bottom_blob_int8_scales).data;
          pAVar5 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar11;
      (this->bottom_blob_int8_scales).elemsize = local_1a8.elemsize;
      (this->bottom_blob_int8_scales).elempack = local_1a8.elempack;
      (this->bottom_blob_int8_scales).allocator = local_1a8.allocator;
      (this->bottom_blob_int8_scales).dims = local_1a8.dims;
      (this->bottom_blob_int8_scales).w = local_1a8.w;
      (this->bottom_blob_int8_scales).h = local_1a8.h;
      (this->bottom_blob_int8_scales).d = local_1a8.d;
      (this->bottom_blob_int8_scales).c = local_1a8.c;
      (this->bottom_blob_int8_scales).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    auVar9 = _DAT_005a3350;
    auVar8 = _DAT_005a3340;
    auVar7 = _DAT_005a3240;
    uVar10 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
    if (0 < (int)uVar10) {
      pvVar4 = pMVar2->data;
      lVar13 = (ulong)uVar10 - 1;
      auVar17._8_4_ = (int)lVar13;
      auVar17._0_8_ = lVar13;
      auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar14 = 0;
      auVar17 = auVar17 ^ _DAT_005a3240;
      do {
        auVar22._8_4_ = (int)uVar14;
        auVar22._0_8_ = uVar14;
        auVar22._12_4_ = (int)(uVar14 >> 0x20);
        auVar24 = (auVar22 | auVar9) ^ auVar7;
        iVar19 = auVar17._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar19 && auVar17._0_4_ < auVar24._0_4_ ||
                    iVar19 < auVar24._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4) = uVar3;
        }
        if ((auVar24._12_4_ != auVar17._12_4_ || auVar24._8_4_ <= auVar17._8_4_) &&
            auVar24._12_4_ <= auVar17._12_4_) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 4) = uVar3;
        }
        auVar24 = (auVar22 | auVar8) ^ auVar7;
        iVar25 = auVar24._4_4_;
        if (iVar25 <= iVar19 && (iVar25 != iVar19 || auVar24._0_4_ <= auVar17._0_4_)) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 8) = uVar3;
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 0xc) = uVar3;
        }
        uVar14 = uVar14 + 4;
      } while ((uVar10 + 3 & 0xfffffffc) != uVar14);
    }
  }
  iVar19 = this->int8_scale_term;
LAB_003d58fc:
  if (100 < iVar19) {
    (*mb->_vptr_ModelBin[2])(&local_1a8,mb,1);
    pMVar1 = &this->top_blob_int8_scales;
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (pMVar1 != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->top_blob_int8_scales).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->top_blob_int8_scales).data;
          pAVar5 = (this->top_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->top_blob_int8_scales).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->top_blob_int8_scales).refcount = piVar11;
      (this->top_blob_int8_scales).elemsize = local_1a8.elemsize;
      (this->top_blob_int8_scales).elempack = local_1a8.elempack;
      (this->top_blob_int8_scales).allocator = local_1a8.allocator;
      (this->top_blob_int8_scales).dims = local_1a8.dims;
      (this->top_blob_int8_scales).w = local_1a8.w;
      (this->top_blob_int8_scales).h = local_1a8.h;
      (this->top_blob_int8_scales).d = local_1a8.d;
      (this->top_blob_int8_scales).c = local_1a8.c;
      (this->top_blob_int8_scales).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar3 = *(this->top_blob_int8_scales).data;
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    Mat::create(&local_1a8,this->group,4,(Allocator *)0x0);
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (pMVar1 != &local_1a8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->top_blob_int8_scales).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar4 = (this->top_blob_int8_scales).data;
          pAVar5 = (this->top_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->top_blob_int8_scales).data = local_1a8.data;
      piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      (this->top_blob_int8_scales).refcount = piVar11;
      (this->top_blob_int8_scales).elemsize = local_1a8.elemsize;
      (this->top_blob_int8_scales).elempack = local_1a8.elempack;
      (this->top_blob_int8_scales).allocator = local_1a8.allocator;
      (this->top_blob_int8_scales).dims = local_1a8.dims;
      (this->top_blob_int8_scales).w = local_1a8.w;
      (this->top_blob_int8_scales).h = local_1a8.h;
      (this->top_blob_int8_scales).d = local_1a8.d;
      (this->top_blob_int8_scales).c = local_1a8.c;
      (this->top_blob_int8_scales).cstep = local_1a8.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    auVar9 = _DAT_005a3350;
    auVar8 = _DAT_005a3340;
    auVar7 = _DAT_005a3240;
    uVar10 = (this->top_blob_int8_scales).c * (int)(this->top_blob_int8_scales).cstep;
    if (0 < (int)uVar10) {
      pvVar4 = pMVar1->data;
      lVar13 = (ulong)uVar10 - 1;
      auVar18._8_4_ = (int)lVar13;
      auVar18._0_8_ = lVar13;
      auVar18._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar14 = 0;
      auVar18 = auVar18 ^ _DAT_005a3240;
      do {
        auVar23._8_4_ = (int)uVar14;
        auVar23._0_8_ = uVar14;
        auVar23._12_4_ = (int)(uVar14 >> 0x20);
        auVar24 = (auVar23 | auVar9) ^ auVar7;
        iVar19 = auVar18._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar19 && auVar18._0_4_ < auVar24._0_4_ ||
                    iVar19 < auVar24._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4) = uVar3;
        }
        if ((auVar24._12_4_ != auVar18._12_4_ || auVar24._8_4_ <= auVar18._8_4_) &&
            auVar24._12_4_ <= auVar18._12_4_) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 4) = uVar3;
        }
        auVar24 = (auVar23 | auVar8) ^ auVar7;
        iVar25 = auVar24._4_4_;
        if (iVar25 <= iVar19 && (iVar25 != iVar19 || auVar24._0_4_ <= auVar18._0_4_)) {
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 8) = uVar3;
          *(undefined4 *)((long)pvVar4 + uVar14 * 4 + 0xc) = uVar3;
        }
        uVar14 = uVar14 + 4;
      } while ((uVar10 + 3 & 0xfffffffc) != uVar14);
    }
  }
  if (((this->weight_data).elemsize == 4) && (this->int8_scale_term != 0)) {
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    Mat::create(&local_1a8,this->weight_data_size,1,(Allocator *)0x0);
    bVar6 = true;
    if ((local_1a8.data != (void *)0x0) && ((long)local_1a8.c * local_1a8.cstep != 0)) {
      local_154 = this->weight_data_size / this->group;
      if (0 < this->group) {
        sVar12 = (size_t)local_154;
        lVar13 = 0;
        lVar15 = 0;
        do {
          Option::Option(&local_70);
          local_70.num_threads = 1;
          local_70.blob_allocator = local_1a8.allocator;
          local_70.use_packing_layout = false;
          local_100.elemsize = (this->weight_data).elemsize;
          local_100.data = (void *)(local_100.elemsize * lVar13 + (long)(this->weight_data).data);
          local_100.elempack = (this->weight_data).elempack;
          local_100.allocator = (this->weight_data).allocator;
          local_100.refcount = (int *)0x0;
          local_100.dims = 1;
          local_100.w = local_154;
          local_100.h = 1;
          local_100.d = 1;
          local_100.c = 1;
          local_148.data = (void *)(local_1a8.elemsize * lVar13 + (long)local_1a8.data);
          local_148.refcount = (int *)0x0;
          local_148.elemsize = local_1a8.elemsize;
          local_148.elempack = local_1a8.elempack;
          local_148.allocator = local_1a8.allocator;
          local_148.dims = 1;
          local_148.w = local_154;
          local_148.h = 1;
          local_148.d = 1;
          local_148.c = 1;
          local_b8.elemsize = (this->weight_data_int8_scales).elemsize;
          local_b8.data =
               (void *)(local_b8.elemsize * lVar15 + (long)(this->weight_data_int8_scales).data);
          local_b8.elempack = (this->weight_data_int8_scales).elempack;
          local_b8.allocator = (this->weight_data_int8_scales).allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.dims = 1;
          local_b8.w = 1;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          local_b8.cstep = 1;
          local_148.cstep = sVar12;
          local_100.cstep = sVar12;
          quantize_to_int8(&local_100,&local_148,&local_b8,&local_70);
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + -1;
            UNLOCK();
            if (*local_b8.refcount == 0) {
              if (local_b8.allocator == (Allocator *)0x0) {
                if (local_b8.data != (void *)0x0) {
                  free(local_b8.data);
                }
              }
              else {
                (*(local_b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_148.refcount != (int *)0x0) {
            LOCK();
            *local_148.refcount = *local_148.refcount + -1;
            UNLOCK();
            if (*local_148.refcount == 0) {
              if (local_148.allocator == (Allocator *)0x0) {
                if (local_148.data != (void *)0x0) {
                  free(local_148.data);
                }
              }
              else {
                (*(local_148.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_100.refcount != (int *)0x0) {
            LOCK();
            *local_100.refcount = *local_100.refcount + -1;
            UNLOCK();
            if (*local_100.refcount == 0) {
              if (local_100.allocator == (Allocator *)0x0) {
                if (local_100.data != (void *)0x0) {
                  free(local_100.data);
                }
              }
              else {
                (*(local_100.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + sVar12;
        } while (lVar15 < this->group);
      }
      if (local_150 != &local_1a8) {
        piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + 1;
          UNLOCK();
        }
        piVar11 = (this->weight_data).refcount;
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            pvVar4 = (this->weight_data).data;
            pAVar5 = (this->weight_data).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).data = local_1a8.data;
        (this->weight_data).refcount =
             (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        (this->weight_data).elemsize = local_1a8.elemsize;
        (this->weight_data).elempack = local_1a8.elempack;
        (this->weight_data).allocator = local_1a8.allocator;
        (this->weight_data).dims = local_1a8.dims;
        (this->weight_data).w = local_1a8.w;
        (this->weight_data).h = local_1a8.h;
        (this->weight_data).d = local_1a8.d;
        (this->weight_data).c = local_1a8.c;
        (this->weight_data).cstep = local_1a8.cstep;
      }
      bVar6 = false;
    }
    piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar6) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term == 1 || int8_scale_term == 101)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2 || int8_scale_term == 102)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);

        float top_blob_int8_scale = top_blob_int8_scales[0];
        top_blob_int8_scales = Mat(group);
        top_blob_int8_scales.fill(top_blob_int8_scale);
    }
#endif // NCNN_INT8

#if NCNN_INT8
    // runtime quantize the weight data
    if (weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q;
            opt_q.num_threads = 1;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#endif // NCNN_INT8

    return 0;
}